

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnAlgebraicCon
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,int index,
          NumericExpr expr)

{
  NumericExpr expr_00;
  MutAlgebraicCon MVar1;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  MVar1 = BasicProblem<mp::BasicProblemParams<int>_>::algebraic_con
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  expr_00.super_ExprBase.impl_._4_4_ = in_stack_ffffffffffffffd4;
  expr_00.super_ExprBase.impl_._0_4_ =
       MVar1.
       super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::set_nonlinear_expr
            ((MutAlgebraicCon *)
             MVar1.
             super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
             .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_,
             expr_00);
  return;
}

Assistant:

void OnAlgebraicCon(int index, NumericExpr expr) {
    builder_.algebraic_con(index).set_nonlinear_expr(expr);
  }